

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProvider.cpp
# Opt level: O0

void __thiscall
TextProviderString::TextProviderString
          (TextProviderString *this,shared_ptr<PSLogger> *p_logger,string *p_text)

{
  ulong uVar1;
  element_type *peVar2;
  allocator<char> local_81;
  string local_80 [32];
  string local_60 [48];
  shared_ptr<PSLogger> local_30;
  string *local_20;
  string *p_text_local;
  shared_ptr<PSLogger> *p_logger_local;
  TextProviderString *this_local;
  
  local_20 = p_text;
  p_text_local = (string *)p_logger;
  p_logger_local = (shared_ptr<PSLogger> *)this;
  std::shared_ptr<PSLogger>::shared_ptr(&local_30,p_logger);
  TextProvider::TextProvider(&this->super_TextProvider,&local_30);
  std::shared_ptr<PSLogger>::~shared_ptr(&local_30);
  (this->super_TextProvider)._vptr_TextProvider = (_func_int **)&PTR__TextProviderString_0020ec60;
  std::__cxx11::string::string((string *)&this->m_text,(string *)p_text);
  std::
  optional<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::optional(&this->m_iterator);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    (this->super_TextProvider).m_current_char_idx = 0;
  }
  else {
    peVar2 = std::__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &(this->super_TextProvider).m_logger);
    std::__cxx11::string::string
              (local_60,(string *)&TextProvider::m_parser_text_provider_log_cat_abi_cxx11_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_80,"text provided is empty. Parsing will fail.",&local_81);
    (*peVar2->_vptr_PSLogger[2])(peVar2,4,local_60,local_80);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
    std::__cxx11::string::~string(local_60);
    (this->super_TextProvider).m_has_error = true;
  }
  return;
}

Assistant:

TextProviderString::TextProviderString(shared_ptr<PSLogger> p_logger, string p_text)
:TextProvider(p_logger), m_text(p_text)
{
	//todo add some kind of check in case the logger isn't valid

	if(m_text.empty())
	{
		m_logger->log(PSLogger::LogType::Error, m_parser_text_provider_log_cat, "text provided is empty. Parsing will fail.");
		m_has_error = true;
	}
	else
	{
		m_current_char_idx = 0;
	}
}